

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.h
# Opt level: O0

void GetOpt::_Option::setTokenAsUsed(Token *token,ShortOptions *short_ops,Type usedAs)

{
  key_type *__x;
  Type usedAs_local;
  ShortOptions *short_ops_local;
  Token *token_local;
  
  if (token->type == PossibleNegativeArgument) {
    __x = (key_type *)std::__cxx11::string::operator[]((ulong)&token->value);
    std::
    map<char,_GetOpt::OptionData,_std::less<char>,_std::allocator<std::pair<const_char,_GetOpt::OptionData>_>_>
    ::erase(short_ops,__x);
  }
  token->type = usedAs;
  return;
}

Assistant:

static void setTokenAsUsed(Token* token, ShortOptions& short_ops, Token::Type usedAs)
    {
        if (token->type == Token::PossibleNegativeArgument)
            short_ops.erase(token->value[1]);

        token->type = usedAs;
    }